

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::
PerformAction<bool(solitaire::archivers::interfaces::Snapshot_const&)>
          (Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *action,
          ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<bool> *pAVar2;
  _Head_base<0UL,_const_solitaire::archivers::interfaces::Snapshot_&,_false> local_20;
  
  pAVar2 = (ActionResultHolder<bool> *)operator_new(0x10);
  local_20._M_head_impl =
       (args->super__Tuple_impl<0UL,_const_solitaire::archivers::interfaces::Snapshot_&>).
       super__Head_base<0UL,_const_solitaire::archivers::interfaces::Snapshot_&,_false>._M_head_impl
  ;
  RVar1 = Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)>::Perform
                    (action,(ArgumentTuple *)&local_20);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_0031e500;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }